

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expressions.cpp
# Opt level: O1

unique_ptr<const_IRT::CExpressionList,_std::default_delete<const_IRT::CExpressionList>_> __thiscall
IRT::CExpressionList::Copy(CExpressionList *this)

{
  _func_int **pp_Var1;
  long lVar2;
  ulong uVar3;
  pointer *__ptr;
  long in_RSI;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> copy;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_48;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_40;
  _Head_base<0UL,_const_IRT::CExpressionList_*,_false> local_38;
  
  local_38._M_head_impl = this;
  pp_Var1 = (_func_int **)operator_new(0x20);
  *pp_Var1 = (_func_int *)&PTR_Accept_00183368;
  pp_Var1[1] = (_func_int *)0x0;
  pp_Var1[2] = (_func_int *)0x0;
  pp_Var1[3] = (_func_int *)0x0;
  lVar2 = *(long *)(in_RSI + 8);
  if (*(long *)(in_RSI + 0x10) != lVar2) {
    uVar3 = 0;
    do {
      (**(code **)(**(long **)(lVar2 + uVar3 * 8) + 0x18))(&local_40);
      local_48._M_head_impl = local_40._M_head_impl;
      local_40._M_head_impl = (CExpression *)0x0;
      std::
      vector<std::unique_ptr<IRT::CExpression_const,std::default_delete<IRT::CExpression_const>>,std::allocator<std::unique_ptr<IRT::CExpression_const,std::default_delete<IRT::CExpression_const>>>>
      ::
      emplace_back<std::unique_ptr<IRT::CExpression_const,std::default_delete<IRT::CExpression_const>>>
                ((vector<std::unique_ptr<IRT::CExpression_const,std::default_delete<IRT::CExpression_const>>,std::allocator<std::unique_ptr<IRT::CExpression_const,std::default_delete<IRT::CExpression_const>>>>
                  *)(pp_Var1 + 1),
                 (unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *
                 )&local_48);
      if (local_48._M_head_impl != (CExpression *)0x0) {
        (*((local_48._M_head_impl)->super_IExpression).super_INode._vptr_INode[2])();
      }
      local_48._M_head_impl = (CExpression *)0x0;
      if (local_40._M_head_impl != (CExpression *)0x0) {
        (*((local_40._M_head_impl)->super_IExpression).super_INode._vptr_INode[2])();
      }
      uVar3 = uVar3 + 1;
      lVar2 = *(long *)(in_RSI + 8);
    } while (uVar3 < (ulong)(*(long *)(in_RSI + 0x10) - lVar2 >> 3));
  }
  ((local_38._M_head_impl)->super_IExpression).super_INode._vptr_INode = pp_Var1;
  return (__uniq_ptr_data<const_IRT::CExpressionList,_std::default_delete<const_IRT::CExpressionList>,_true,_true>
          )(tuple<const_IRT::CExpressionList_*,_std::default_delete<const_IRT::CExpressionList>_>)
           local_38._M_head_impl;
}

Assistant:

std::unique_ptr<const IRT::CExpressionList> IRT::CExpressionList::Copy( ) const {
    CExpressionList *newList = new CExpressionList( );

    for ( int i = 0; i < expressions.size( ); ++i ) {
        std::unique_ptr<const CExpression> copy = expressions[ i ].get( )->Copy( );
        newList->Add( std::move( copy ));
    }
    return std::move( std::unique_ptr<const CExpressionList>( newList ));
}